

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

MPP_RET set_enc_info_to_packet(MppEncImpl *enc,HalEncTask *hal_task)

{
  void *pvVar1;
  EncRcTask *pEVar2;
  MppMeta meta_00;
  bool bVar3;
  bool local_4e;
  RK_U32 is_pskip;
  MppMeta meta;
  MppPacket packet;
  EncFrmStatus *frm;
  EncRcTask *rc_task;
  Mpp *mpp;
  HalEncTask *hal_task_local;
  MppEncImpl *enc_local;
  
  pvVar1 = enc->mpp;
  pEVar2 = hal_task->rc_task;
  meta_00 = mpp_packet_get_meta(hal_task->packet);
  if (meta_00 == (MppMeta)0x0) {
    _mpp_log_l(2,"mpp_enc","failed to get meta from packet\n","set_enc_info_to_packet");
    enc_local._4_4_ = MPP_NOK;
  }
  else {
    if ((enc->coding == MPP_VIDEO_CodingHEVC) || (enc->coding == MPP_VIDEO_CodingAVC)) {
      bVar3 = true;
      if ((((pEVar2->info).lvl64_inter_num == 0) &&
          (((bVar3 = true, (pEVar2->info).lvl32_inter_num == 0 &&
            (bVar3 = true, (pEVar2->info).lvl16_inter_num == 0)) &&
           (bVar3 = true, (pEVar2->info).lvl8_inter_num == 0)))) &&
         (((bVar3 = true, (pEVar2->info).lvl32_intra_num == 0 &&
           (bVar3 = true, (pEVar2->info).lvl16_intra_num == 0)) &&
          (bVar3 = true, (pEVar2->info).lvl8_intra_num == 0)))) {
        bVar3 = (pEVar2->info).lvl4_intra_num != 0;
      }
      mpp_meta_set_s32(meta_00,KEY_LVL64_INTER_NUM,(pEVar2->info).lvl64_inter_num);
      mpp_meta_set_s32(meta_00,KEY_LVL32_INTER_NUM,(pEVar2->info).lvl32_inter_num);
      mpp_meta_set_s32(meta_00,KEY_LVL16_INTER_NUM,(pEVar2->info).lvl16_inter_num);
      mpp_meta_set_s32(meta_00,KEY_LVL8_INTER_NUM,(pEVar2->info).lvl8_inter_num);
      mpp_meta_set_s32(meta_00,KEY_LVL32_INTRA_NUM,(pEVar2->info).lvl32_intra_num);
      mpp_meta_set_s32(meta_00,KEY_LVL16_INTRA_NUM,(pEVar2->info).lvl16_intra_num);
      mpp_meta_set_s32(meta_00,KEY_LVL8_INTRA_NUM,(pEVar2->info).lvl8_intra_num);
      mpp_meta_set_s32(meta_00,KEY_LVL4_INTRA_NUM,(pEVar2->info).lvl4_intra_num);
      mpp_meta_set_s64(meta_00,KEY_ENC_SSE,(pEVar2->info).sse);
      local_4e = ((uint)((pEVar2->frm).val >> 0x24) & 1) != 0 || (bool)(bVar3 ^ 1);
      mpp_meta_set_s32(meta_00,KEY_OUTPUT_PSKIP,(uint)local_4e);
      mpp_meta_set_s32(meta_00,KEY_ENC_BPS_RT,(pEVar2->info).rt_bits);
      if ((pEVar2->info).frame_type == INTER_VI_FRAME) {
        mpp_meta_set_s32(meta_00,KEY_ENC_USE_LTR,(uint)((pEVar2->cpb).refr.val >> 8) & 0xf);
      }
    }
    mpp_meta_set_s32(meta_00,KEY_OUTPUT_INTRA,(uint)((pEVar2->frm).val >> 4) & 1);
    mpp_meta_set_s32(meta_00,KEY_ENC_START_QP,(pEVar2->info).quality_target);
    mpp_meta_set_s32(meta_00,KEY_ENC_AVERAGE_QP,(pEVar2->info).quality_real);
    if (hal_task->md_info != (MppBuffer)0x0) {
      mpp_meta_set_buffer(meta_00,KEY_MOTION_INFO,hal_task->md_info);
    }
    if (*(int *)((long)pvVar1 + 0xb8) != 0) {
      mpp_meta_set_frame(meta_00,KEY_INPUT_FRAME,hal_task->frame);
    }
    enc_local._4_4_ = MPP_OK;
  }
  return enc_local._4_4_;
}

Assistant:

static MPP_RET set_enc_info_to_packet(MppEncImpl *enc, HalEncTask *hal_task)
{
    Mpp *mpp = (Mpp*)enc->mpp;
    EncRcTask *rc_task = hal_task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    MppPacket packet = hal_task->packet;
    MppMeta meta = mpp_packet_get_meta(packet);

    if (!meta) {
        mpp_err_f("failed to get meta from packet\n");
        return MPP_NOK;
    }

    if (enc->coding == MPP_VIDEO_CodingHEVC || enc->coding == MPP_VIDEO_CodingAVC) {
        RK_U32 is_pskip = !(rc_task->info.lvl64_inter_num ||
                            rc_task->info.lvl32_inter_num ||
                            rc_task->info.lvl16_inter_num ||
                            rc_task->info.lvl8_inter_num  ||
                            rc_task->info.lvl32_intra_num ||
                            rc_task->info.lvl16_intra_num ||
                            rc_task->info.lvl8_intra_num  ||
                            rc_task->info.lvl4_intra_num);

        /* num of inter different size predicted block */
        mpp_meta_set_s32(meta, KEY_LVL64_INTER_NUM, rc_task->info.lvl64_inter_num);
        mpp_meta_set_s32(meta, KEY_LVL32_INTER_NUM, rc_task->info.lvl32_inter_num);
        mpp_meta_set_s32(meta, KEY_LVL16_INTER_NUM, rc_task->info.lvl16_inter_num);
        mpp_meta_set_s32(meta, KEY_LVL8_INTER_NUM,  rc_task->info.lvl8_inter_num);
        /* num of intra different size predicted block */
        mpp_meta_set_s32(meta, KEY_LVL32_INTRA_NUM, rc_task->info.lvl32_intra_num);
        mpp_meta_set_s32(meta, KEY_LVL16_INTRA_NUM, rc_task->info.lvl16_intra_num);
        mpp_meta_set_s32(meta, KEY_LVL8_INTRA_NUM,  rc_task->info.lvl8_intra_num);
        mpp_meta_set_s32(meta, KEY_LVL4_INTRA_NUM,  rc_task->info.lvl4_intra_num);

        mpp_meta_set_s64(meta, KEY_ENC_SSE,  rc_task->info.sse);
        mpp_meta_set_s32(meta, KEY_OUTPUT_PSKIP,    frm->force_pskip || is_pskip);
        mpp_meta_set_s32(meta, KEY_ENC_BPS_RT, rc_task->info.rt_bits);

        if (rc_task->info.frame_type == INTER_VI_FRAME)
            mpp_meta_set_s32(meta, KEY_ENC_USE_LTR, rc_task->cpb.refr.lt_idx);
    }
    /* frame type */
    mpp_meta_set_s32(meta, KEY_OUTPUT_INTRA,    frm->is_intra);

    /* start qp and average qp */
    mpp_meta_set_s32(meta, KEY_ENC_START_QP,    rc_task->info.quality_target);
    mpp_meta_set_s32(meta, KEY_ENC_AVERAGE_QP,  rc_task->info.quality_real);

    if (hal_task->md_info)
        mpp_meta_set_buffer(meta, KEY_MOTION_INFO, hal_task->md_info);

    if (mpp->mEncAyncIo)
        mpp_meta_set_frame(meta, KEY_INPUT_FRAME, hal_task->frame);

    return MPP_OK;
}